

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O0

TransformationType __thiscall QTransform::type(QTransform *this)

{
  ushort uVar1;
  bool bVar2;
  double d;
  long in_RDI;
  qreal dot;
  TransformationType local_4;
  
  if (((*(ushort *)(in_RDI + 0x48) >> 5 & 0x1f) == 0) ||
     ((*(ushort *)(in_RDI + 0x48) >> 5 & 0x1f) < (*(ushort *)(in_RDI + 0x48) & 0x1f))) {
    uVar1 = *(ushort *)(in_RDI + 0x48);
    goto LAB_0066d776;
  }
  d = (double)(ulong)(*(ushort *)(in_RDI + 0x48) >> 5 & 0x1f);
  switch(d) {
  case 0.0:
switchD_0066d5a9_caseD_0:
    *(ushort *)(in_RDI + 0x48) = *(ushort *)(in_RDI + 0x48) & 0xffe0;
    break;
  case 4.94065645841247e-324:
switchD_0066d5a9_caseD_1:
    bVar2 = qFuzzyIsNull(d);
    if ((bVar2) && (bVar2 = qFuzzyIsNull(d), bVar2)) goto switchD_0066d5a9_caseD_0;
    *(ushort *)(in_RDI + 0x48) = *(ushort *)(in_RDI + 0x48) & 0xffe0 | 1;
    break;
  case 9.88131291682493e-324:
switchD_0066d5a9_caseD_2:
    bVar2 = qFuzzyIsNull(d);
    if ((bVar2) && (bVar2 = qFuzzyIsNull(d), bVar2)) goto switchD_0066d5a9_caseD_1;
    *(ushort *)(in_RDI + 0x48) = *(ushort *)(in_RDI + 0x48) & 0xffe0 | 2;
    break;
  case 1.97626258336499e-323:
  case 3.95252516672997e-323:
switchD_0066d5a9_caseD_4:
    bVar2 = qFuzzyIsNull(d);
    if ((bVar2) && (bVar2 = qFuzzyIsNull(d), bVar2)) goto switchD_0066d5a9_caseD_2;
    bVar2 = qFuzzyIsNull(d);
    if (bVar2) {
      *(ushort *)(in_RDI + 0x48) = *(ushort *)(in_RDI + 0x48) & 0xffe0 | 4;
    }
    else {
      *(ushort *)(in_RDI + 0x48) = *(ushort *)(in_RDI + 0x48) & 0xffe0 | 8;
    }
    break;
  case 7.90505033345994e-323:
    bVar2 = qFuzzyIsNull(d);
    if (((bVar2) && (bVar2 = qFuzzyIsNull(d), bVar2)) && (bVar2 = qFuzzyIsNull(d), bVar2))
    goto switchD_0066d5a9_caseD_4;
    *(ushort *)(in_RDI + 0x48) = *(ushort *)(in_RDI + 0x48) & 0xffe0 | 0x10;
  }
  *(ushort *)(in_RDI + 0x48) = *(ushort *)(in_RDI + 0x48) & 0xfc1f;
  uVar1 = *(ushort *)(in_RDI + 0x48);
LAB_0066d776:
  local_4 = (TransformationType)(uVar1 & 0x1f);
  return local_4;
}

Assistant:

QTransform::TransformationType QTransform::type() const
{
    if (m_dirty == TxNone || m_dirty < m_type)
        return static_cast<TransformationType>(m_type);

    switch (static_cast<TransformationType>(m_dirty)) {
    case TxProject:
        if (!qFuzzyIsNull(m_matrix[0][2]) || !qFuzzyIsNull(m_matrix[1][2]) || !qFuzzyIsNull(m_matrix[2][2] - 1)) {
             m_type = TxProject;
             break;
        }
        Q_FALLTHROUGH();
    case TxShear:
    case TxRotate:
        if (!qFuzzyIsNull(m_matrix[0][1]) || !qFuzzyIsNull(m_matrix[1][0])) {
            const qreal dot = m_matrix[0][0] * m_matrix[1][0] + m_matrix[0][1] * m_matrix[1][1];
            if (qFuzzyIsNull(dot))
                m_type = TxRotate;
            else
                m_type = TxShear;
            break;
        }
        Q_FALLTHROUGH();
    case TxScale:
        if (!qFuzzyIsNull(m_matrix[0][0] - 1) || !qFuzzyIsNull(m_matrix[1][1] - 1)) {
            m_type = TxScale;
            break;
        }
        Q_FALLTHROUGH();
    case TxTranslate:
        if (!qFuzzyIsNull(m_matrix[2][0]) || !qFuzzyIsNull(m_matrix[2][1])) {
            m_type = TxTranslate;
            break;
        }
        Q_FALLTHROUGH();
    case TxNone:
        m_type = TxNone;
        break;
    }

    m_dirty = TxNone;
    return static_cast<TransformationType>(m_type);
}